

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall ON_SubDMeshImpl::ON_SubDMeshImpl(ON_SubDMeshImpl *this,ON_SubDMeshImpl *src)

{
  bool bVar1;
  size_t sVar2;
  ON_SubDMeshFragment *finished_fragment;
  ON_SubDMeshFragment *fragment;
  ON_SubDMeshFragment *src_fragment;
  ON_SubDMeshImpl *src_local;
  ON_SubDMeshImpl *this_local;
  
  this->m_mesh_content_serial_number = 0;
  this->m_absolute_subd_display_density = 0;
  this->m_fragment_count = 0;
  this->m_fragment_point_count = 0;
  this->m_first_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_last_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_has_curvatures = (bool)(src->m_has_curvatures & 1);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  std::weak_ptr<ON_SubDimple>::weak_ptr(&this->m_subdimple_wp);
  this->m_fragment_tree = (ON_RTree *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp);
  ChangeContentSerialNumber(this);
  if (src->m_first_fragment != (ON_SubDMeshFragment *)0x0) {
    sVar2 = ON_FixedSizePool::ActiveElementCount(&src->m_fsp);
    bVar1 = ReserveCapacity(this,(uint)sVar2,src->m_absolute_subd_display_density);
    if (bVar1) {
      for (fragment = src->m_first_fragment; fragment != (ON_SubDMeshFragment *)0x0;
          fragment = fragment->m_next_fragment) {
        finished_fragment = CopyCallbackFragment(this,fragment);
        AddFinishedFragment(this,finished_fragment);
      }
    }
  }
  return;
}

Assistant:

ON_SubDMeshImpl::ON_SubDMeshImpl( const class ON_SubDMeshImpl& src )
    : m_has_curvatures(src.m_has_curvatures)
{
  ChangeContentSerialNumber();
  if (nullptr != src.m_first_fragment &&
      ReserveCapacity((unsigned int)src.m_fsp.ActiveElementCount(),src.m_absolute_subd_display_density))
  {
    for (const ON_SubDMeshFragment* src_fragment = src.m_first_fragment; nullptr != src_fragment; src_fragment = src_fragment->m_next_fragment)
    {
      ON_SubDMeshFragment* fragment = CopyCallbackFragment(src_fragment);
      AddFinishedFragment(fragment);
    }
  }
}